

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<std::complex<float>_>::AddKel
          (TPZFrontNonSym<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  _ComplexT _Var1;
  long lVar2;
  complex<float> *pcVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  complex<float> *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar2 = sourceindex->fNElements;
  lVar9 = 0;
  lVar6 = 0;
  if (0 < lVar2) {
    lVar6 = lVar2;
  }
  for (; lVar9 != lVar6; lVar9 = lVar9 + 1) {
    iVar4 = Local(this,destinationindex->fStore[lVar9]);
    for (lVar10 = 0; lVar2 != lVar10; lVar10 = lVar10 + 1) {
      iVar5 = Local(this,destinationindex->fStore[lVar10]);
      pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                         (elmat,sourceindex->fStore[lVar9],sourceindex->fStore[lVar10]);
      lVar8 = (long)(this->super_TPZFront<std::complex<float>_>).fMaxFront * (long)iVar5;
      pcVar3 = (this->super_TPZFront<std::complex<float>_>).fData.fStore;
      _Var1 = pcVar3[lVar8 + iVar4]._M_value;
      pcVar3[lVar8 + iVar4]._M_value =
           CONCAT44((float)(_Var1 >> 0x20) + (float)(pcVar7->_M_value >> 0x20),
                    (float)_Var1 + (float)pcVar7->_M_value);
    }
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = 0; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}